

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

Value * __thiscall
minja::UnaryOpExpr::do_evaluate(UnaryOpExpr *this,shared_ptr<minja::Context> *context)

{
  bool bVar1;
  runtime_error *prVar2;
  Value *this_00;
  long in_RSI;
  Value *in_RDI;
  Value e;
  shared_ptr<minja::Context> *in_stack_00000120;
  Expression *in_stack_00000128;
  Value *in_stack_ffffffffffffff38;
  Value *in_stack_ffffffffffffff40;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x20));
  if (bVar1) {
    std::__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2eca52);
    Expression::evaluate(in_stack_00000128,in_stack_00000120);
    this_00 = (Value *)(ulong)*(uint *)(in_RSI + 0x30);
    switch(this_00) {
    case (Value *)0x0:
      Value::Value(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      break;
    case (Value *)0x1:
      Value::operator-(this_00);
      break;
    case (Value *)0x2:
      Value::to_bool(this_00);
      Value::Value(in_stack_ffffffffffffff40,(bool *)in_stack_ffffffffffffff38);
      break;
    case (Value *)0x3:
    case (Value *)0x4:
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar2,"Expansion operator is only supported in function calls and collections");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    default:
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"Unknown unary operator");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    Value::~Value(in_stack_ffffffffffffff40);
    return in_RDI;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar2,"UnaryOpExpr.expr is null");
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Value do_evaluate(const std::shared_ptr<Context> & context) const override {
        if (!expr) throw std::runtime_error("UnaryOpExpr.expr is null");
        auto e = expr->evaluate(context);
        switch (op) {
            case Op::Plus: return e;
            case Op::Minus: return -e;
            case Op::LogicalNot: return !e.to_bool();
            case Op::Expansion:
            case Op::ExpansionDict:
                throw std::runtime_error("Expansion operator is only supported in function calls and collections");

        }
        throw std::runtime_error("Unknown unary operator");
    }